

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log2floor_debruijn_forPow2_::run
          (Test_intlog_log2floor_debruijn_forPow2_ *this)

{
  Test_intlog_log2floor_debruijn_forPow2_ *this_local;
  
  (anonymous_namespace)::
  test_log2_floor_forPow2<(unsigned_int(*)(unsigned_int))(&bitmanip::log2floor_debruijn),(unsigned_long(*)(unsigned_long))0>
            ();
  return;
}

Assistant:

BITMANIP_TEST(intlog, log2floor_debruijn_forPow2)
{
    test_log2_floor_forPow2<log2floor_debruijn>();
}